

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O1

LY_ERR ly_out_reset(ly_out *out)

{
  char **ppcVar1;
  int iVar2;
  int *piVar3;
  __off_t _Var4;
  char *pcVar5;
  char *format;
  LY_ERR LVar6;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_reset");
    return LY_EINVAL;
  }
  switch(out->type) {
  case LY_OUT_FD:
    _Var4 = lseek((out->method).fd,0,0);
    if (_Var4 != -1) {
LAB_0013b7d8:
      piVar3 = __errno_location();
      if (*piVar3 == 0x1d) {
        return LY_SUCCESS;
      }
      iVar2 = (out->method).fd;
      goto LAB_0013b7ef;
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0x1d) goto LAB_0013b7d8;
    pcVar5 = strerror(*piVar3);
    format = "Seeking output file descriptor failed (%s).";
    goto LAB_0013b852;
  case LY_OUT_FDSTREAM:
  case LY_OUT_FILE:
  case LY_OUT_FILEPATH:
    iVar2 = fseek((FILE *)(out->method).f,0,0);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x1d) {
        pcVar5 = strerror(*piVar3);
        format = "Seeking output file stream failed (%s).";
        goto LAB_0013b852;
      }
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0x1d) {
      return LY_SUCCESS;
    }
    iVar2 = fileno((FILE *)(out->method).f);
LAB_0013b7ef:
    iVar2 = ftruncate(iVar2,0);
    if (iVar2 != -1) {
      return LY_SUCCESS;
    }
    pcVar5 = strerror(*piVar3);
    format = "Truncating output file failed (%s).";
LAB_0013b852:
    LVar6 = LY_ESYS;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,format,pcVar5);
    break;
  case LY_OUT_MEMORY:
    ppcVar1 = (out->method).mem.buf;
    if ((ppcVar1 != (char **)0x0) && (pcVar5 = *ppcVar1, pcVar5 != (char *)0x0)) {
      memset(pcVar5,0,(out->method).mem.len);
    }
    LVar6 = LY_SUCCESS;
    out->printed = 0;
    (out->method).fpath.filepath = (char *)0x0;
    break;
  case LY_OUT_ERROR:
    LVar6 = LY_EINT;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x131);
    break;
  default:
    LVar6 = LY_SUCCESS;
  }
  return LVar6;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_out_reset(struct ly_out *out)
{
    LY_CHECK_ARG_RET(NULL, out, LY_EINVAL);

    switch (out->type) {
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    case LY_OUT_FD:
        if ((lseek(out->method.fd, 0, SEEK_SET) == -1) && (errno != ESPIPE)) {
            LOGERR(NULL, LY_ESYS, "Seeking output file descriptor failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        if ((errno != ESPIPE) && (ftruncate(out->method.fd, 0) == -1)) {
            LOGERR(NULL, LY_ESYS, "Truncating output file failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        break;
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILE:
    case LY_OUT_FILEPATH:
        if ((fseek(out->method.f, 0, SEEK_SET) == -1) && (errno != ESPIPE)) {
            LOGERR(NULL, LY_ESYS, "Seeking output file stream failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        if ((errno != ESPIPE) && (ftruncate(fileno(out->method.f), 0) == -1)) {
            LOGERR(NULL, LY_ESYS, "Truncating output file failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        break;
    case LY_OUT_MEMORY:
        if (out->method.mem.buf && *out->method.mem.buf) {
            memset(*out->method.mem.buf, 0, out->method.mem.len);
        }
        out->printed = 0;
        out->method.mem.len = 0;
        break;
    case LY_OUT_CALLBACK:
        /* nothing to do (not seekable) */
        break;
    }

    return LY_SUCCESS;
}